

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_CollapseIrredundant(Vec_Str_t *vSop,int nCubes,int nVars)

{
  uint uVar1;
  lit *begin;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  sat_solver *s;
  void *pvVar7;
  void *Entry;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int i;
  char *Entry_00;
  
  p = Vec_IntAlloc(nVars);
  Entry_00 = vSop->pArray;
  p_00 = Vec_PtrAlloc(nCubes);
  uVar1 = nVars + 3;
  if (vSop->nSize != nCubes * uVar1 + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                  ,0xd5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
  }
  for (; *Entry_00 != '\0'; Entry_00 = Entry_00 + (int)uVar1) {
    Vec_PtrPush(p_00,Entry_00);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nVars);
  iVar6 = p_00->nSize;
  iVar5 = 0;
  iVar8 = iVar6;
  uVar10 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar10 = 0;
  }
LAB_0045f4f2:
  do {
    i = iVar8 + -1;
    if (iVar8 < 1) {
LAB_0045f5fe:
      if (iVar5 != 0 && iVar8 == 0) {
        iVar5 = 0;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        iVar8 = 0;
        for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
          pvVar7 = Vec_PtrEntry(p_00,iVar5);
          if (pvVar7 != (void *)0x0) {
            for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
              Vec_StrWriteEntry(vSop,(int)uVar10 + iVar8,*(char *)((long)pvVar7 + uVar10));
            }
            iVar8 = iVar8 + (int)uVar10;
          }
        }
        Vec_StrWriteEntry(vSop,iVar8,'\0');
        Vec_StrShrink(vSop,iVar8 + 1);
        i = iVar6;
      }
      sat_solver_delete(s);
      Vec_PtrFree(p_00);
      Vec_IntFree(p);
      return (int)(i == -1);
    }
    pvVar7 = Vec_PtrEntry(p_00,i);
    p->nSize = 0;
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      if (*(char *)((long)pvVar7 + uVar9) != '-') {
        iVar2 = Abc_Var2Lit((int)uVar9,(uint)(*(char *)((long)pvVar7 + uVar9) == '1'));
        Vec_IntPush(p,iVar2);
      }
    }
    begin = p->pArray;
    iVar2 = p->nSize;
    iVar3 = sat_solver_solve(s,begin,begin + iVar2,0,0,0,0);
    if (iVar3 != 1) {
      if (iVar3 != -1) {
        if (iVar3 != 0) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                        ,0xef,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
        }
        goto LAB_0045f5fe;
      }
      Vec_PtrWriteEntry(p_00,i,Entry);
      iVar5 = iVar5 + 1;
      iVar8 = i;
      goto LAB_0045f4f2;
    }
    iVar3 = 0;
    iVar8 = iVar2;
    if (iVar2 < 1) {
      iVar8 = iVar3;
    }
    for (; iVar8 != iVar3; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(p,iVar3);
      iVar4 = Abc_LitNot(iVar4);
      Vec_IntWriteEntry(p,iVar3,iVar4);
    }
    iVar2 = sat_solver_addclause(s,begin,begin + iVar2);
    iVar8 = i;
    if (iVar2 != 1) {
      __assert_fail("status == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0xf5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
    }
  } while( true );
}

Assistant:

int Bmc_CollapseIrredundant( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, iLit, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    // iterate through cubes in the reverse order
    Vec_PtrForEachEntryReverse( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        // if it does, then it should be added
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
        // make a clause out of the cube by complementing its literals
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == -1 && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}